

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int wally_tx_add_output_at(wally_tx *tx,uint32_t index,wally_tx_output *output)

{
  byte bVar1;
  _Bool _Var2;
  int iVar3;
  uint64_t in_RAX;
  wally_tx_output *src;
  ulong uVar4;
  size_t sVar5;
  uint64_t total;
  
  bVar1 = output->features;
  total = in_RAX;
  _Var2 = is_valid_tx(tx);
  iVar3 = -2;
  if (_Var2) {
    uVar4 = (ulong)index;
    sVar5 = tx->num_outputs;
    if (uVar4 <= sVar5) {
      if ((bVar1 & 1) == 0) {
        if ((output->script != (uchar *)0x0) == (output->script_len == 0)) {
          return -2;
        }
        if (2100000000000000 < output->satoshi) {
          return -2;
        }
        iVar3 = wally_tx_get_total_output_satoshi(tx,&total);
        if (iVar3 != 0) {
          return -2;
        }
        if (2100000000000000 < output->satoshi + total || CARRY8(output->satoshi,total)) {
          return -2;
        }
        sVar5 = tx->num_outputs;
      }
      else {
        _Var2 = is_valid_elements_tx_output(output);
        if (!_Var2) {
          return -2;
        }
      }
      src = tx->outputs;
      if (tx->outputs_allocation_len <= sVar5) {
        src = (wally_tx_output *)realloc_array(src,tx->outputs_allocation_len,sVar5 + 1,0x70);
        if (src == (wally_tx_output *)0x0) {
          return -3;
        }
        clear_and_free(tx->outputs,tx->num_outputs * 0x70);
        tx->outputs = src;
        tx->outputs_allocation_len = tx->outputs_allocation_len + 1;
        sVar5 = tx->num_outputs;
      }
      memmove(src + uVar4 + 1,src + uVar4,(sVar5 - uVar4) * 0x70);
      iVar3 = wally_tx_output_clone(output,tx->outputs + uVar4);
      if (iVar3 == 0) {
        tx->num_outputs = tx->num_outputs + 1;
        iVar3 = 0;
      }
      else {
        memmove(tx->outputs + uVar4,tx->outputs + uVar4 + 1,(tx->num_outputs - uVar4) * 0x70);
      }
    }
  }
  return iVar3;
}

Assistant:

int wally_tx_add_output_at(struct wally_tx *tx, uint32_t index,
                           const struct wally_tx_output *output)
{
    uint64_t total;
    int ret;
    const bool is_elements = output->features & WALLY_TX_IS_ELEMENTS;

    if (!is_valid_tx(tx) || index > tx->num_outputs)
        return WALLY_EINVAL;

    if (!is_elements) {
        if (!is_valid_tx_output(output) ||
            wally_tx_get_total_output_satoshi(tx, &total) != WALLY_OK ||
            total + output->satoshi < total || total + output->satoshi > WALLY_SATOSHI_MAX)
            return WALLY_EINVAL;
    } else if (!is_valid_elements_tx_output(output))
        return WALLY_EINVAL;

    if (tx->num_outputs >= tx->outputs_allocation_len) {
        /* Expand the outputs array */
        struct wally_tx_output *p;
        p = realloc_array(tx->outputs, tx->outputs_allocation_len,
                          tx->num_outputs + 1, sizeof(*tx->outputs));
        if (!p)
            return WALLY_ENOMEM;

        clear_and_free(tx->outputs, tx->num_outputs * sizeof(*tx->outputs));
        tx->outputs = p;
        tx->outputs_allocation_len += 1;
    }

    memmove(tx->outputs + index + 1, tx->outputs + index,
            (tx->num_outputs - index) * sizeof(*output));

    if ((ret = wally_tx_output_clone(output, tx->outputs + index)) != WALLY_OK) {
        memmove(tx->outputs + index, tx->outputs + index + 1,
                (tx->num_outputs - index) * sizeof(*output)); /* Undo */
        return ret;
    }

    tx->num_outputs += 1;
    return WALLY_OK;
}